

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O2

Argument * __thiscall
argparse::ArgumentParser::add_argument<char_const*>(ArgumentParser *this,char *f_args)

{
  list<argparse::Argument,_std::allocator<argparse::Argument>_> *__position;
  iterator it;
  __off64_t *in_R8;
  size_t in_R9;
  uint in_stack_ffffffffffffffc8;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_1UL> local_30;
  
  __position = &this->m_optional_arguments;
  local_30._M_elems[0]._M_len = strlen(f_args);
  local_30._M_elems[0]._M_str = f_args;
  it = std::__cxx11::list<argparse::Argument,std::allocator<argparse::Argument>>::
       emplace<std::__cxx11::string&,std::array<std::basic_string_view<char,std::char_traits<char>>,1ul>>
                 ((list<argparse::Argument,std::allocator<argparse::Argument>> *)__position,
                  (const_iterator)__position,&this->m_prefix_chars,&local_30);
  if (((ulong)it._M_node[0x15]._M_next & 2) == 0) {
    std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::splice
              (&this->m_positional_arguments,(int)&this->m_positional_arguments,
               (__off64_t *)__position,(int)it._M_node,in_R8,in_R9,in_stack_ffffffffffffffc8);
  }
  index_argument(this,(argument_it)it._M_node);
  return (Argument *)(it._M_node + 1);
}

Assistant:

Argument &add_argument(Targs... f_args) {
    using array_of_sv = std::array<std::string_view, sizeof...(Targs)>;
    auto argument =
        m_optional_arguments.emplace(std::cend(m_optional_arguments),
                                     m_prefix_chars, array_of_sv{f_args...});

    if (!argument->m_is_optional) {
      m_positional_arguments.splice(std::cend(m_positional_arguments),
                                    m_optional_arguments, argument);
    }

    index_argument(argument);
    return *argument;
  }